

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O3

void Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1check_1set
               (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_,jboolean jarg2)

{
  if (jarg1 != 0) {
    *(bool *)(jarg1 + 0xd9) = jarg2 != '\0';
  }
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1check_1set(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_, jboolean jarg2) {
  opt_s *arg1 = (opt_s *) 0 ;
  bool arg2 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  arg2 = jarg2 ? true : false; 
  if (arg1) (arg1)->check = arg2;
}